

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

void __thiscall
TasGrid::GridLocalPolynomial::addChild<(TasGrid::RuleLocal::erule)2>
          (GridLocalPolynomial *this,int *point,int direction,MultiIndexSet *exclude,
          Data2D<int> *destination)

{
  int iVar1;
  int i;
  int kid_number;
  vector<int,_std::allocator<int>_> kid;
  allocator_type local_49;
  int *local_48 [2];
  long local_38;
  
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)local_48,point,
             point + (this->super_BaseCanonicalGrid).num_dimensions,&local_49);
  kid_number = 0;
  do {
    iVar1 = RuleLocal::getKid<(TasGrid::RuleLocal::erule)2>(point[direction],kid_number);
    local_48[0][direction] = iVar1;
    if (iVar1 != -1) {
      iVar1 = MultiIndexSet::getSlot(exclude,local_48[0]);
      if (iVar1 == -1) {
        ::std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)&destination->vec,
                   (destination->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_48[0],local_48[0] + destination->stride);
        destination->num_strips = destination->num_strips + 1;
      }
    }
    kid_number = kid_number + 1;
  } while (kid_number == 1);
  if (local_48[0] != (int *)0x0) {
    operator_delete(local_48[0],local_38 - (long)local_48[0]);
  }
  return;
}

Assistant:

void GridLocalPolynomial::addChild(const int point[], int direction, const MultiIndexSet &exclude, Data2D<int> &destination) const{
    std::vector<int> kid(point, point + num_dimensions);
    int max_1d_kids = RuleLocal::getMaxNumKids<effrule>();
    for(int i=0; i<max_1d_kids; i++){
        kid[direction] = RuleLocal::getKid<effrule>(point[direction], i);
        if ((kid[direction] != -1) && exclude.missing(kid)){
            destination.appendStrip(kid);
        }
    }
}